

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::validateSGD(ValidationContext *this)

{
  uint *puVar1;
  uint *args_4;
  ktx_uint64_t kVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  uint uVar6;
  uint32_t uVar7;
  void *__s;
  long lVar8;
  ulong uVar9;
  int iVar10;
  pointer pkVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint32_t imageIndex;
  ulong uVar15;
  byte bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar27;
  undefined1 auVar26 [16];
  uint uVar28;
  int iVar29;
  undefined1 in_XMM12 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint32_t imageCount;
  ktx_uint64_t sgdByteLength;
  uint64_t expectedBgdByteLength;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  void *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  kVar2 = (this->header).supercompressionGlobalData.byteOffset;
  uVar15 = (this->header).supercompressionGlobalData.byteLength;
  if (uVar15 != 0 && kVar2 != 0) {
    local_48 = uVar15;
    __s = operator_new__(uVar15);
    memset(__s,0,uVar15);
    local_50 = __s;
    (*this->_vptr_ValidationContext[2])(this,kVar2,__s,uVar15,7,"the SGD");
    if ((this->header).supercompressionScheme == 1) {
      local_54 = 0;
      uVar7 = this->numLevels;
      if (uVar7 == 0) {
        lVar8 = 0x14;
      }
      else {
        uVar13 = (this->header).pixelDepth;
        uVar12 = (this->header).faceCount * this->numLayers;
        uVar6 = uVar7 + 3 & 0xfffffffc;
        iVar10 = uVar7 - 1;
        auVar18._4_4_ = iVar10;
        auVar18._0_4_ = iVar10;
        auVar18._8_4_ = iVar10;
        auVar18._12_4_ = iVar10;
        auVar21._4_4_ = uVar13;
        auVar21._0_4_ = uVar13;
        auVar21._8_4_ = uVar13;
        auVar21._12_4_ = uVar13;
        auVar24 = _DAT_001fb350;
        auVar23 = (undefined1  [16])0x0;
        do {
          auVar22 = auVar23;
          auVar19 = auVar24;
          auVar24 = pshuflw(in_XMM9,auVar19,0xfe);
          uVar27 = uVar13 >> auVar24._0_8_;
          auVar24 = pshuflw(auVar24,auVar19,0x54);
          uVar28 = uVar13 >> auVar24._0_8_;
          auVar25._0_8_ = auVar19._8_8_;
          auVar25._8_4_ = auVar19._8_4_;
          auVar25._12_4_ = auVar19._12_4_;
          auVar24 = pshuflw(in_XMM12,auVar25,0xfe);
          lVar8 = auVar24._0_8_;
          auVar4._4_8_ = auVar21._8_8_;
          auVar4._0_4_ = uVar13 >> lVar8;
          auVar31._0_8_ = auVar4._0_8_ << 0x20;
          auVar31._8_4_ = uVar13 >> lVar8;
          auVar31._12_4_ = uVar13 >> lVar8;
          auVar24 = pshuflw(auVar25,auVar25,0x54);
          lVar8 = auVar24._0_8_;
          auVar5._4_8_ = auVar21._8_8_;
          auVar5._0_4_ = uVar13 >> lVar8;
          auVar30._0_8_ = auVar5._0_8_ << 0x20;
          auVar30._8_4_ = uVar13 >> lVar8;
          auVar30._12_4_ = uVar13 >> lVar8;
          in_XMM12._8_8_ = auVar31._8_8_;
          in_XMM12._0_8_ = auVar30._8_8_;
          iVar10 = uVar27 + (uVar27 == 0);
          iVar29 = auVar31._12_4_ + (auVar31._12_4_ == 0);
          auVar3._4_4_ = uVar12;
          auVar3._0_4_ = uVar12;
          auVar3._8_4_ = uVar12;
          auVar3._12_4_ = uVar12;
          auVar26._4_4_ = iVar10;
          auVar26._0_4_ = iVar10;
          auVar26._8_4_ = iVar29;
          auVar26._12_4_ = iVar29;
          auVar23._0_4_ = uVar12 * (uVar28 + (uVar28 == 0)) + auVar22._0_4_;
          auVar23._4_4_ = iVar10 * uVar12 + auVar22._4_4_;
          auVar23._8_4_ =
               (int)((auVar3._8_8_ & 0xffffffff) * (ulong)(auVar30._8_4_ + (auVar30._8_4_ == 0))) +
               auVar22._8_4_;
          auVar23._12_4_ = (int)((auVar26._8_8_ & 0xffffffff) * (ulong)uVar12) + auVar22._12_4_;
          auVar24._0_4_ = auVar19._0_4_ + 4;
          auVar24._4_4_ = auVar19._4_4_ + 4;
          auVar24._8_4_ = auVar19._8_4_ + 4;
          auVar24._12_4_ = auVar19._12_4_ + 4;
          uVar6 = uVar6 - 4;
          in_XMM9 = auVar22;
        } while (uVar6 != 0);
        auVar18 = auVar18 ^ _DAT_001fb370;
        auVar19 = auVar19 ^ _DAT_001fb370;
        auVar20._0_4_ = -(uint)(auVar18._0_4_ < auVar19._0_4_);
        auVar20._4_4_ = -(uint)(auVar18._4_4_ < auVar19._4_4_);
        auVar20._8_4_ = -(uint)(auVar18._8_4_ < auVar19._8_4_);
        auVar20._12_4_ = -(uint)(auVar18._12_4_ < auVar19._12_4_);
        auVar24 = ~auVar20 & auVar23 | auVar22 & auVar20;
        local_54 = auVar24._12_4_ + auVar24._4_4_ + auVar24._8_4_ + auVar24._0_4_;
        lVar8 = (ulong)local_54 * 0x14 + 0x14;
      }
      if (local_48 < 0x14) {
        error<unsigned_long_const&>(this,&SGD::BLZESizeTooSmallHeader,&local_48);
      }
      else {
        local_38 = (ulong)*(uint *)((long)local_50 + 8) + (ulong)*(uint *)((long)local_50 + 0x10) +
                   (ulong)*(uint *)((long)local_50 + 4) + (ulong)*(uint *)((long)local_50 + 0xc) +
                   lVar8;
        if (local_48 != local_38) {
          error<unsigned_long_const&,unsigned_int&,unsigned_long_const&>
                    (this,&SGD::BLZESizeIncorrect,&local_48,&local_54,&local_38);
        }
        if ((((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_engaged == true) &&
            ((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
             super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value == KHR_DF_MODEL_ETC1S
            )) && (*(uint *)((long)local_50 + 0x10) != 0)) {
          error<unsigned_int_const&>
                    (this,&SGD::BLZEExtendedByteLengthNotZero,(uint *)((long)local_50 + 0x10));
        }
        if ((ulong)local_54 * 0x14 + 0x14 <= local_48) {
          local_64 = 0;
          uVar13 = this->numLevels;
          if (uVar13 != 0) {
            local_40 = (long)local_50 + 0x14;
            uVar6 = this->numLayers;
            uVar15 = 0;
            bVar16 = 0;
            uVar12 = uVar6;
            do {
              local_58 = 0;
              if (uVar12 == 0) {
                uVar12 = 0;
              }
              else {
                uVar13 = (this->header).faceCount;
                uVar27 = local_64;
                do {
                  local_5c = 0;
                  bVar17 = uVar13 != 0;
                  uVar13 = 0;
                  if (bVar17) {
                    do {
                      local_60 = 0;
                      do {
                        args_4 = (uint *)(local_40 + uVar15 * 0x14);
                        uVar13 = *args_4;
                        if ((uVar13 & 0xfffffffd) != 0) {
                          error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                                    (this,&SGD::BLZEInvalidImageFlagBit,&local_64,&local_58,
                                     &local_5c,&local_60,args_4);
                        }
                        puVar1 = args_4 + 2;
                        uVar6 = args_4[2];
                        if (uVar6 == 0) {
                          error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                                    (this,&SGD::BLZEZeroRGBLength,&local_64,&local_58,&local_5c,
                                     &local_60,puVar1);
                          uVar6 = *puVar1;
                        }
                        uVar9 = (ulong)local_64;
                        pkVar11 = (this->levelIndices).
                                  super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        uVar14 = pkVar11[uVar9].byteLength;
                        if (uVar14 < uVar6 + args_4[1]) {
                          error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                                    (this,&SGD::BLZEInvalidRGBSlice,&local_64,&local_58,&local_5c,
                                     &local_60,args_4 + 1,puVar1,&pkVar11[uVar9].byteLength);
                          uVar9 = (ulong)local_64;
                          pkVar11 = (this->levelIndices).
                                    super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          uVar14 = pkVar11[uVar9].byteLength;
                        }
                        puVar1 = args_4 + 4;
                        uVar6 = args_4[4];
                        if (uVar14 < args_4[3] + uVar6) {
                          error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                                    (this,&SGD::BLZEInvalidAlphaSlice,&local_64,&local_58,&local_5c,
                                     &local_60,args_4 + 3,puVar1,&pkVar11[uVar9].byteLength);
                          uVar6 = *puVar1;
                        }
                        uVar7 = this->numSamples;
                        if (uVar7 == 2 && uVar6 == 0) {
                          error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&>
                                    (this,&SGD::BLZEDFDMismatchAlpha,&local_64,&local_58,&local_5c,
                                     &local_60);
                          uVar6 = *puVar1;
                          uVar7 = this->numSamples;
                        }
                        if ((uVar6 != 0) && (uVar7 == 1)) {
                          error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                                    (this,&SGD::BLZEDFDMismatchNoAlpha,&local_64,&local_58,&local_5c
                                     ,&local_60,puVar1);
                        }
                        bVar16 = bVar16 | (byte)((uVar13 & 2) >> 1);
                        local_60 = local_60 + 1;
                        uVar13 = (this->header).pixelDepth >> ((byte)local_64 & 0x1f);
                        uVar15 = (ulong)((int)uVar15 + 1);
                      } while (local_60 < uVar13 + (uVar13 == 0));
                      local_5c = local_5c + 1;
                      uVar13 = (this->header).faceCount;
                    } while (local_5c < uVar13);
                    uVar6 = this->numLayers;
                    uVar27 = local_64;
                  }
                  local_58 = local_58 + 1;
                } while (local_58 < uVar6);
                uVar13 = this->numLevels;
                uVar12 = uVar6;
                local_64 = uVar27;
              }
              local_64 = local_64 + 1;
            } while (local_64 < uVar13);
            if ((bVar16 != 0) && (this->foundKTXanimData == false)) {
              error<>(this,&SGD::BLZENoAnimationSequencesPFrame);
            }
          }
        }
      }
    }
    operator_delete__(local_50);
  }
  return;
}

Assistant:

void ValidationContext::validateSGD() {
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    if (sgdByteOffset == 0 || sgdByteLength == 0)
        return; // There is no SGD block

    const auto buffer = std::make_unique<uint8_t[]>(sgdByteLength);
    read(sgdByteOffset, buffer.get(), sgdByteLength, "the SGD");

    if (header.supercompressionScheme != KTX_SS_BASIS_LZ)
        return;

    // Validate BASIS_LZ SGD

    uint32_t imageCount = 0;
    // uint32_t layersFaces = numLayers * header.faceCount;
    for (uint32_t level = 0; level < numLevels; ++level)
        // numFaces * depth is only reasonable because they can't both be > 1. There are no 3D cubemaps
        imageCount += numLayers * header.faceCount * std::max(header.pixelDepth >> level, 1u);

    // Validate GlobalHeader
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader)) {
        error(SGD::BLZESizeTooSmallHeader, sgdByteLength);
        return;
    }

    const ktxBasisLzGlobalHeader& bgh = *reinterpret_cast<const ktxBasisLzGlobalHeader*>(buffer.get());

    const uint64_t expectedBgdByteLength =
            sizeof(ktxBasisLzGlobalHeader) +
            sizeof(ktxBasisLzEtc1sImageDesc) * imageCount +
            bgh.endpointsByteLength +
            bgh.selectorsByteLength +
            bgh.tablesByteLength +
            bgh.extendedByteLength;
    if (sgdByteLength != expectedBgdByteLength)
        error(SGD::BLZESizeIncorrect, sgdByteLength, imageCount, expectedBgdByteLength);

    if (parsedColorModel && *parsedColorModel == KHR_DF_MODEL_ETC1S && bgh.extendedByteLength != 0)
        error(SGD::BLZEExtendedByteLengthNotZero, bgh.extendedByteLength);

    // Validate ImageDesc
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader) + sizeof(ktxBasisLzEtc1sImageDesc) * imageCount)
        return;

    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(buffer.get());

    bool foundPFrame = false;
    uint32_t i = 0;
    for (uint32_t level = 0; level < numLevels; ++level) {
        for (uint32_t layer = 0; layer < numLayers; ++layer) {
            for (uint32_t face = 0; face < header.faceCount; ++face) {
                for (uint32_t zSlice = 0; zSlice < std::max(header.pixelDepth >> level, 1u); ++zSlice) {
                    const auto imageIndex = i++;
                    const auto& image = imageDescs[imageIndex];

                    if (image.imageFlags & ETC1S_P_FRAME)
                        foundPFrame = true;

                    if (image.imageFlags & ~ETC1S_P_FRAME)
                        error(SGD::BLZEInvalidImageFlagBit, level, layer, face, zSlice, image.imageFlags);

                    if (image.rgbSliceByteLength == 0)
                        error(SGD::BLZEZeroRGBLength, level, layer, face, zSlice, image.rgbSliceByteLength);

                    if (image.rgbSliceByteOffset + image.rgbSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidRGBSlice, level, layer, face, zSlice, image.rgbSliceByteOffset, image.rgbSliceByteLength, levelIndices[level].byteLength);
                    if (image.alphaSliceByteOffset + image.alphaSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidAlphaSlice, level, layer, face, zSlice, image.alphaSliceByteOffset, image.alphaSliceByteLength, levelIndices[level].byteLength);

                    // Crosscheck with the DFD numSamples
                    if (image.alphaSliceByteLength == 0 && numSamples == 2)
                        error(SGD::BLZEDFDMismatchAlpha, level, layer, face, zSlice);
                    if (image.alphaSliceByteLength != 0 && numSamples == 1)
                        error(SGD::BLZEDFDMismatchNoAlpha, level, layer, face, zSlice, image.alphaSliceByteLength);
                }
            }
        }
    }

    if (foundPFrame)
        if (!foundKTXanimData)
            error(SGD::BLZENoAnimationSequencesPFrame);
}